

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O2

_Rb_tree_node<tcmalloc::Span_*> * __thiscall
tcmalloc::FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_>::Alloc
          (FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *this)

{
  void *result;
  _Rb_tree_node<tcmalloc::Span_*> *p_Var1;
  
  if (this->inited == false) {
    if (this->construct == false) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/fixed_allocator.hpp"
                    ,0x18,
                    "T *tcmalloc::FixedAllocator<std::_Rb_tree_node<tcmalloc::Span *>>::Alloc() [T = std::_Rb_tree_node<tcmalloc::Span *>]"
                   );
    }
    this->area_ = (char *)0x0;
    this->area_free_ = 0;
    this->freelist_ = (void *)0x0;
    this->inited = true;
  }
  else {
    p_Var1 = (_Rb_tree_node<tcmalloc::Span_*> *)this->freelist_;
    if (p_Var1 != (_Rb_tree_node<tcmalloc::Span_*> *)0x0) {
      this->freelist_ = *(void **)&p_Var1->super__Rb_tree_node_base;
      return p_Var1;
    }
  }
  p_Var1 = AllocFromArea(this);
  return p_Var1;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }